

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

bool __thiscall QToolBarPrivate::mouseMoveEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  Orientation OVar1;
  int iVar2;
  int iVar3;
  DragState *pDVar4;
  QWidget *this_00;
  QLayoutItem *hoverTarget;
  QWidgetData *pQVar5;
  bool bVar6;
  int iVar7;
  Representation RVar8;
  int iVar9;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_01;
  QPoint QVar10;
  QWidget *pQVar11;
  QWindow *context;
  QPoint QVar12;
  int iVar13;
  QRect *pQVar14;
  int iVar15;
  Representation *pRVar16;
  DragState *pDVar17;
  long in_FS_OFFSET;
  QPointF QVar18;
  QPoint local_80;
  undefined1 local_78 [16];
  QPointF local_68;
  undefined1 local_58 [16];
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = this->state;
  if (pDVar4 == (DragState *)0x0) goto LAB_0046c511;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  mainWindow = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                         (*(QObject **)&(this->super_QWidgetPrivate).field_0x10);
  if (mainWindow == (QMainWindow *)0x0) goto LAB_0046c511;
  this_01 = qt_mainwindow_layout(mainWindow);
  if (this_01->pluggingWidget == (QWidget *)0x0) {
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)event);
    QVar10 = QPointF::toPoint(&local_48);
    iVar7 = QVar10.xp.m_i.m_i - (this->state->pressPos).xp.m_i;
    iVar13 = QVar10.yp.m_i.m_i - (this->state->pressPos).yp.m_i;
    iVar15 = -iVar7;
    if (0 < iVar7) {
      iVar15 = iVar7;
    }
    iVar7 = -iVar13;
    if (0 < iVar13) {
      iVar7 = iVar13;
    }
    iVar13 = QApplication::startDragDistance();
    if (iVar13 < iVar7 + iVar15) {
      bVar6 = this->state->dragging;
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        OVar1 = this->orientation;
        QVar18 = QSinglePointEvent::position((QSinglePointEvent *)event);
        if (OVar1 == Vertical) {
          local_48 = QVar18;
          QVar10 = QPointF::toPoint(&local_48);
          if (QVar10.xp.m_i.m_i < 0) goto LAB_0046c2aa;
          local_58 = (undefined1  [16])QSinglePointEvent::position((QSinglePointEvent *)event);
          QVar10 = QPointF::toPoint((QPointF *)local_58);
          RVar8 = QVar10.xp.m_i;
          pQVar14 = &this_00->data->crect;
          pRVar16 = &(this_00->data->crect).x2;
        }
        else {
          local_68 = QVar18;
          QVar10 = QPointF::toPoint(&local_68);
          if ((long)QVar10 < 0) goto LAB_0046c2aa;
          local_78 = (undefined1  [16])QSinglePointEvent::position((QSinglePointEvent *)event);
          QVar10 = QPointF::toPoint((QPointF *)local_78);
          RVar8 = QVar10.yp.m_i;
          pRVar16 = &(this_00->data->crect).y2;
          pQVar14 = (QRect *)&(this_00->data->crect).y1;
        }
        iVar15 = (pRVar16->m_i - (pQVar14->x1).m_i) + 1;
        startDrag(this,RVar8.m_i < iVar15);
        if (iVar15 <= RVar8.m_i && (bVar6 & 1U) == 0) {
LAB_0046c2bb:
          QWidget::grabMouse(this_00);
        }
      }
      else {
LAB_0046c2aa:
        startDrag(this,false);
        if (bVar6 == false) goto LAB_0046c2bb;
      }
    }
  }
  pDVar17 = this->state;
  if (pDVar17 == (DragState *)0x0) {
    QWidget::releaseMouse(this_00);
    goto LAB_0046c511;
  }
  if (pDVar17->dragging == true) {
    local_58._0_4_ = -0x55555556;
    local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    QVar10 = QPointF::toPoint(&local_48);
    bVar6 = QWidget::isLeftToRight(this_00);
    iVar15 = (this->state->pressPos).xp.m_i;
    if (bVar6) {
      iVar15 = -iVar15;
    }
    else {
      iVar15 = iVar15 + ~(this_00->data->crect).x2.m_i + (this_00->data->crect).x1.m_i;
    }
    local_58._4_4_ = QVar10.yp.m_i.m_i - (this->state->pressPos).yp.m_i;
    local_58._0_4_ = QVar10.xp.m_i.m_i + iVar15;
    QWidget::move(this_00,(QPoint *)local_58);
    hoverTarget = this->state->widgetItem;
    local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    QVar10 = QPointF::toPoint(&local_48);
    local_68.xp = (qreal)QVar10;
    QMainWindowLayout::hover((QMainWindowLayout *)this_01,hoverTarget,(QPoint *)&local_68);
    goto LAB_0046c511;
  }
  if (pDVar17->moving != true) goto LAB_0046c511;
  local_78._4_4_ = (pDVar17->pressPos).yp.m_i;
  local_78._0_4_ =
       ((this_00->data->crect).x2.m_i - ((this_00->data->crect).x1.m_i + (pDVar17->pressPos).xp.m_i)
       ) + 1;
  bVar6 = QWidget::isRightToLeft(this_00);
  if (bVar6) {
    pDVar17 = (DragState *)local_78;
  }
  else {
    pDVar17 = this->state;
  }
  QVar10 = QWidget::mapToGlobal(this_00,&pDVar17->pressPos);
  local_80 = QVar10;
  pQVar11 = QWidget::window(this_00);
  if (pQVar11 == (QWidget *)0x0) {
LAB_0046c46b:
    local_68 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    QVar12 = QPointF::toPoint(&local_68);
    iVar7 = QVar12.xp.m_i.m_i - QVar10.xp.m_i;
    iVar15 = (int)((long)QVar12 - ((ulong)QVar10 & 0xffffffff00000000) >> 0x20);
  }
  else {
    pQVar11 = QWidget::window(this_00);
    context = QWidget::windowHandle(pQVar11);
    if (context == (QWindow *)0x0) goto LAB_0046c46b;
    local_58 = (undefined1  [16])QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    local_48 = QHighDpi::fromNativePixels<QPointF,QWindow>((QPointF *)local_58,context);
    QVar10 = QPointF::toPoint(&local_48);
    QVar12 = QHighDpi::fromNativePixels<QPoint,QWindow>(&local_80,context);
    iVar7 = QVar10.xp.m_i.m_i - QVar12.xp.m_i;
    iVar15 = (int)((long)QVar10 - ((ulong)QVar12 & 0xffffffff00000000) >> 0x20);
  }
  if (this->orientation == Vertical) {
    iVar13 = QWidget::y(this_00);
    iVar13 = iVar13 + iVar15;
  }
  else {
    bVar6 = QWidget::isRightToLeft(this_00);
    if (bVar6) {
      pQVar5 = (mainWindow->super_QWidget).data;
      iVar15 = (pQVar5->crect).x2.m_i;
      iVar13 = (pQVar5->crect).x1.m_i;
      iVar2 = (this_00->data->crect).x2.m_i;
      iVar3 = (this_00->data->crect).x1.m_i;
      iVar9 = QWidget::x(this_00);
      iVar13 = (iVar15 + iVar3) - (iVar9 + iVar7 + iVar13 + iVar2);
    }
    else {
      iVar13 = QWidget::x(this_00);
      iVar13 = iVar13 + iVar7;
    }
  }
  QMainWindowLayout::moveToolBar((QMainWindowLayout *)this_01,(QToolBar *)this_00,iVar13);
LAB_0046c511:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pDVar4 != (DragState *)0x0;
}

Assistant:

bool QToolBarPrivate::mouseMoveEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);

    if (!state) {
#ifdef Q_OS_MACOS
        if (!macWindowDragging)
            return false;
        QWidget *w = q->window();
        const QPoint delta = event->pos() - macWindowDragPressPosition;
        w->move(w->pos() + delta);
        return true;
#endif
        return false;
    }

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    if (win == nullptr)
        return true;

    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);

    if (layout->pluggingWidget == nullptr
        && (event->position().toPoint() - state->pressPos).manhattanLength() > QApplication::startDragDistance()) {
            const bool wasDragging = state->dragging;
            const bool moving = !q->isWindow() && (orientation == Qt::Vertical ?
                event->position().toPoint().x() >= 0 && event->position().toPoint().x() < q->width() :
                event->position().toPoint().y() >= 0 && event->position().toPoint().y() < q->height());

            startDrag(moving);
            if (!moving && !wasDragging)
                q->grabMouse();
    }

    if (!state) {
        q->releaseMouse();
        return true;
    }

    if (state->dragging) {
        QPoint pos = event->globalPosition().toPoint();
        // if we are right-to-left, we move so as to keep the right edge the same distance
        // from the mouse
        if (q->isLeftToRight())
            pos -= state->pressPos;
        else
            pos += QPoint(state->pressPos.x() - q->width(), -state->pressPos.y());

        q->move(pos);
        layout->hover(state->widgetItem, event->globalPosition().toPoint());
    } else if (state->moving) {

        const QPoint rtl(q->width() - state->pressPos.x(), state->pressPos.y()); //for RTL
        const QPoint globalPressPos = q->mapToGlobal(q->isRightToLeft() ? rtl : state->pressPos);
        int pos = 0;

        const QWindow *handle = q->window() ? q->window()->windowHandle() : nullptr;
        const QPoint delta = handle
                ? QHighDpi::fromNativePixels(event->globalPosition(), handle).toPoint()
                  - QHighDpi::fromNativePixels(globalPressPos, handle)
                : event->globalPosition().toPoint() - globalPressPos;

        if (orientation == Qt::Vertical) {
            pos = q->y() + delta.y();
        } else {
            if (q->isRightToLeft()) {
                pos = win->width() - q->width() - q->x()  - delta.x();
            } else {
                pos = q->x() + delta.x();
            }
        }

        layout->moveToolBar(q, pos);
    }
    return true;
}